

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# components.hpp
# Opt level: O0

holder<cs::range_type> * __thiscall
cs::allocator_type<cs_impl::any::holder<cs::range_type>,64ul,cs_impl::default_allocator_provider>::
alloc<cs::numeric_const&,cs::numeric_const&,int>
          (allocator_type<cs_impl::any::holder<cs::range_type>,_64UL,_cs_impl::default_allocator_provider>
           *this,numeric *args,numeric *args_1,int *args_2)

{
  long lVar1;
  __int_type_conflict _Var2;
  holder<cs::range_type> *__p;
  new_allocator<cs_impl::any::holder<cs::range_type>_> *in_RCX;
  numeric *in_RDI;
  holder<cs::range_type> *ptr;
  numeric *in_stack_ffffffffffffffc8;
  size_type __n;
  
  __n = 0;
  if (*(long *)((long)&in_RDI[0x10].data + 8) != 0) {
    _Var2 = std::__atomic_base::operator_cast_to_unsigned_long((__atomic_base<unsigned_long> *)0x0);
    if (_Var2 == 0) {
      lVar1 = *(long *)((long)&in_RDI[0x10].data + 8);
      *(long *)((long)&in_RDI[0x10].data + 8) = lVar1 + -1;
      __p = *(holder<cs::range_type> **)((long)in_RDI + lVar1 * 8 + -8);
      goto LAB_00233fac;
    }
  }
  __p = __gnu_cxx::new_allocator<cs_impl::any::holder<cs::range_type>_>::allocate(in_RCX,__n,in_RDI)
  ;
LAB_00233fac:
  __gnu_cxx::new_allocator<cs_impl::any::holder<cs::range_type>>::
  construct<cs_impl::any::holder<cs::range_type>,cs::numeric_const&,cs::numeric_const&,int>
            (in_RCX,__p,in_RDI,in_stack_ffffffffffffffc8,(int *)0x233fd1);
  return __p;
}

Assistant:

inline T *alloc(ArgsT &&...args)
		{
			T *ptr = nullptr;
			if (mOffset > 0 && global_thread_counter == 0)
				ptr = mPool[--mOffset];
			else
				ptr = mAlloc.allocate(1);
			mAlloc.construct(ptr, std::forward<ArgsT>(args)...);
			return ptr;
		}